

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::NeuralNetworkPreprocessing
          (NeuralNetworkPreprocessing *this,NeuralNetworkPreprocessing *from)

{
  void *pvVar1;
  string *initial_value;
  NeuralNetworkImageScaler *this_00;
  NeuralNetworkMeanImage *this_01;
  NeuralNetworkImageScaler *from_00;
  NeuralNetworkMeanImage *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__NeuralNetworkPreprocessing_006fe828;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->featurename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  initial_value = (from->featurename_).ptr_;
  if ((initial_value != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
      ) && (initial_value->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->featurename_,initial_value);
  }
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0xb) {
    clear_preprocessor(this);
    this->_oneof_case_[0] = 0xb;
    this_01 = (NeuralNetworkMeanImage *)operator_new(0x28);
    NeuralNetworkMeanImage::NeuralNetworkMeanImage(this_01);
    (this->preprocessor_).meanimage_ = this_01;
    if (from->_oneof_case_[0] == 0xb) {
      from_01 = (from->preprocessor_).meanimage_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (NeuralNetworkMeanImage *)&_NeuralNetworkMeanImage_default_instance_;
    }
    NeuralNetworkMeanImage::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 10) {
    clear_preprocessor(this);
    this->_oneof_case_[0] = 10;
    this_00 = (NeuralNetworkImageScaler *)operator_new(0x28);
    NeuralNetworkImageScaler::NeuralNetworkImageScaler(this_00);
    (this->preprocessor_).scaler_ = this_00;
    if (from->_oneof_case_[0] == 10) {
      from_00 = (from->preprocessor_).scaler_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_00 = (NeuralNetworkImageScaler *)&_NeuralNetworkImageScaler_default_instance_;
    }
    NeuralNetworkImageScaler::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

NeuralNetworkPreprocessing::NeuralNetworkPreprocessing(const NeuralNetworkPreprocessing& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  featurename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.featurename().size() > 0) {
    featurename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.featurename_);
  }
  clear_has_preprocessor();
  switch (from.preprocessor_case()) {
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::NeuralNetworkImageScaler::MergeFrom(from.scaler());
      break;
    }
    case kMeanImage: {
      mutable_meanimage()->::CoreML::Specification::NeuralNetworkMeanImage::MergeFrom(from.meanimage());
      break;
    }
    case PREPROCESSOR_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NeuralNetworkPreprocessing)
}